

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_lua_generator.cc
# Opt level: O3

string * __thiscall
t_lua_generator::argument_list
          (string *__return_storage_ptr__,t_lua_generator *this,t_struct *tstruct,string *prefix)

{
  pointer pptVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  pptVar1 = (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (pptVar1 !=
      (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    do {
      std::operator+(&local_50,prefix,&(*pptVar1)->name_);
      std::__cxx11::string::_M_append
                ((char *)__return_storage_ptr__,(ulong)local_50._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      pptVar1 = pptVar1 + 1;
      if (pptVar1 ==
          (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        return __return_storage_ptr__;
      }
      std::__cxx11::string::append((char *)__return_storage_ptr__);
    } while (pptVar1 !=
             (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  return __return_storage_ptr__;
}

Assistant:

string t_lua_generator::argument_list(t_struct* tstruct, string prefix) {
  const vector<t_field*>& fields = tstruct->get_members();
  vector<t_field*>::const_iterator fld_iter;
  std::string ret = "";
  for (fld_iter = fields.begin(); fld_iter != fields.end();) {
    ret += prefix + (*fld_iter)->get_name();
    ++fld_iter;
    if (fld_iter != fields.end()) {
      ret += ", ";
    }
  }
  return ret;
}